

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O2

void Assimp::LogFunctions<Assimp::IFCImporter>::LogInfo(format *message)

{
  bool bVar1;
  Logger *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    this = DefaultLogger::get();
    std::__cxx11::stringbuf::str();
    std::operator+(&local_58,"IFC: ",&local_38);
    Logger::info(this,local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

static void LogInfo(const Formatter::format& message)   {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_INFO(Prefix()+(std::string)message);
        }
    }